

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

Template * __thiscall
inja::Parser::parse(Template *__return_storage_ptr__,Parser *this,string_view input,path *path)

{
  allocator<char> local_49;
  string local_48;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = input._M_str;
  local_28._M_len = input._M_len;
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_48,&local_28,&local_49);
  Template::Template(__return_storage_ptr__,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  parse_into(this,__return_storage_ptr__,path);
  return __return_storage_ptr__;
}

Assistant:

Template parse(std::string_view input, std::filesystem::path path) {
    auto result = Template(std::string(input));
    parse_into(result, path);
    return result;
  }